

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_superior_type
              (char *name,char *mod_name,lys_module *module,lys_node *parent,lys_tpdf **ret)

{
  byte bVar1;
  LYS_NODE LVar2;
  lys_include *plVar3;
  lys_submodule *plVar4;
  int iVar5;
  uint uVar6;
  char *name_00;
  long lVar7;
  lys_tpdf *plVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (mod_name == (char *)0x0) {
    lVar7 = 1;
    do {
      plVar8 = ly_types[lVar7];
      iVar5 = strcmp(plVar8->name,name);
      if (iVar5 == 0) goto LAB_00115c6a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x14);
    name_00 = (char *)0x0;
  }
  else {
    iVar5 = strcmp(mod_name,module->name);
    name_00 = (char *)0x0;
    if (iVar5 != 0) {
      name_00 = mod_name;
    }
  }
  if ((parent == (lys_node *)0x0) || (name_00 != (char *)0x0)) {
    module = lyp_get_module(module,(char *)0x0,0,name_00,0,0);
    if (module == (lys_module *)0x0) {
      return -1;
    }
  }
  else {
    do {
      LVar2 = parent->nodetype;
      if ((int)LVar2 < 0x200) {
        if ((int)LVar2 < 0x80) {
          if (LVar2 == LYS_CONTAINER) {
            uVar6 = (uint)*(ushort *)(parent->padding + 2);
          }
          else {
            if (LVar2 != LYS_LIST) goto LAB_00115b75;
            uVar6 = (uint)parent->padding[1];
          }
          lVar7 = 0x80;
        }
        else {
          if ((LVar2 != LYS_NOTIF) && (LVar2 != LYS_RPC)) goto LAB_00115b75;
LAB_00115b29:
          uVar6 = (uint)*(ushort *)(parent->padding + 2);
          lVar7 = 0x70;
        }
LAB_00115b4e:
        if (uVar6 != 0) {
          plVar8 = *(lys_tpdf **)(parent->padding + lVar7 + -0x1c);
          uVar9 = (ulong)uVar6;
          do {
            iVar5 = strcmp(plVar8->name,name);
            if (iVar5 == 0) goto LAB_00115c57;
            plVar8 = plVar8 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
      else if ((int)LVar2 < 0x800) {
        if ((LVar2 == LYS_INPUT) || (LVar2 == LYS_OUTPUT)) {
LAB_00115b36:
          uVar6 = (uint)*(ushort *)(parent->padding + 2);
          lVar7 = 0x68;
          goto LAB_00115b4e;
        }
      }
      else {
        if (LVar2 == LYS_GROUPING) goto LAB_00115b36;
        if (LVar2 == LYS_ACTION) goto LAB_00115b29;
      }
LAB_00115b75:
      parent = lys_parent(parent);
    } while (parent != (lys_node *)0x0);
  }
  uVar9 = (ulong)module->tpdf_size;
  if (uVar9 != 0) {
    plVar8 = module->tpdf;
    do {
      iVar5 = strcmp(plVar8->name,name);
      if (iVar5 == 0) {
LAB_00115c57:
        iVar5 = resolve_superior_type_check(&plVar8->type);
        if (iVar5 != 0) {
          return 1;
        }
LAB_00115c6a:
        if (ret != (lys_tpdf **)0x0) {
          *ret = plVar8;
        }
        return 0;
      }
      plVar8 = plVar8 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  bVar1 = module->inc_size;
  if ((ulong)bVar1 != 0) {
    plVar3 = module->inc;
    uVar9 = 0;
    do {
      plVar4 = plVar3[uVar9].submodule;
      if (plVar4 == (lys_submodule *)0x0) {
        return 1;
      }
      uVar10 = (ulong)plVar4->tpdf_size;
      if (uVar10 != 0) {
        plVar8 = plVar4->tpdf;
        do {
          iVar5 = strcmp(plVar8->name,name);
          if (iVar5 == 0) goto LAB_00115c57;
          plVar8 = plVar8 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != bVar1);
  }
  return 1;
}

Assistant:

int
resolve_superior_type(const char *name, const char *mod_name, const struct lys_module *module,
                      const struct lys_node *parent, struct lys_tpdf **ret)
{
    int i, j;
    struct lys_tpdf *tpdf, *match;
    int tpdf_size;

    if (!mod_name) {
        /* no prefix, try built-in types */
        for (i = 1; i < LY_DATA_TYPE_COUNT; i++) {
            if (!strcmp(ly_types[i]->name, name)) {
                if (ret) {
                    *ret = ly_types[i];
                }
                return EXIT_SUCCESS;
            }
        }
    } else {
        if (!strcmp(mod_name, module->name)) {
            /* prefix refers to the current module, ignore it */
            mod_name = NULL;
        }
    }

    if (!mod_name && parent) {
        /* search in local typedefs */
        while (parent) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                tpdf_size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;

            case LYS_LIST:
                tpdf_size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;

            case LYS_GROUPING:
                tpdf_size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;

            case LYS_RPC:
            case LYS_ACTION:
                tpdf_size = ((struct lys_node_rpc_action *)parent)->tpdf_size;
                tpdf = ((struct lys_node_rpc_action *)parent)->tpdf;
                break;

            case LYS_NOTIF:
                tpdf_size = ((struct lys_node_notif *)parent)->tpdf_size;
                tpdf = ((struct lys_node_notif *)parent)->tpdf;
                break;

            case LYS_INPUT:
            case LYS_OUTPUT:
                tpdf_size = ((struct lys_node_inout *)parent)->tpdf_size;
                tpdf = ((struct lys_node_inout *)parent)->tpdf;
                break;

            default:
                parent = lys_parent(parent);
                continue;
            }

            for (i = 0; i < tpdf_size; i++) {
                if (!strcmp(tpdf[i].name, name)) {
                    match = &tpdf[i];
                    goto check_typedef;
                }
            }

            parent = lys_parent(parent);
        }
    } else {
        /* get module where to search */
        module = lyp_get_module(module, NULL, 0, mod_name, 0, 0);
        if (!module) {
            return -1;
        }
    }

    /* search in top level typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        if (!strcmp(module->tpdf[i].name, name)) {
            match = &module->tpdf[i];
            goto check_typedef;
        }
    }

    /* search in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; i++) {
        for (j = 0; j < module->inc[i].submodule->tpdf_size; j++) {
            if (!strcmp(module->inc[i].submodule->tpdf[j].name, name)) {
                match = &module->inc[i].submodule->tpdf[j];
                goto check_typedef;
            }
        }
    }

    return EXIT_FAILURE;

check_typedef:
    if (resolve_superior_type_check(&match->type)) {
        return EXIT_FAILURE;
    }

    if (ret) {
        *ret = match;
    }
    return EXIT_SUCCESS;
}